

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

SplitTxOutRequestStruct * __thiscall
cfd::js::api::json::SplitTxOutRequest::ConvertToStruct
          (SplitTxOutRequestStruct *__return_storage_ptr__,SplitTxOutRequest *this)

{
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  local_30;
  
  SplitTxOutRequestStruct::SplitTxOutRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->is_elements = this->is_elements_;
  __return_storage_ptr__->index = this->index_;
  core::JsonObjectVector<cfd::js::api::json::SplitTxOutData,_cfd::js::api::SplitTxOutDataStruct>::
  ConvertToStruct(&local_30,&this->txouts_);
  std::
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>::
  _M_move_assign(&__return_storage_ptr__->txouts,&local_30);
  std::
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>::
  ~vector(&local_30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

SplitTxOutRequestStruct SplitTxOutRequest::ConvertToStruct() const {  // NOLINT
  SplitTxOutRequestStruct result;
  result.tx = tx_;
  result.is_elements = is_elements_;
  result.index = index_;
  result.txouts = txouts_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}